

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O2

void __thiscall BamTools::FilterTool::FilterTool(FilterTool *this)

{
  FilterSettings *pFVar1;
  OptionGroup *pOVar2;
  string *psVar3;
  allocator local_3ba;
  allocator local_3b9;
  string local_3b8;
  string local_398;
  string boolArg;
  string isDupDesc;
  string isFailQcDesc;
  string flagDesc;
  string insertDesc;
  string lengthDesc;
  string inDesc;
  string isMateMappedDesc;
  string isMappedDesc;
  string isFirstMateDesc;
  string queryDesc;
  string nameDesc;
  string mapQualDesc;
  string listDesc;
  string regionDesc;
  string outDesc;
  string isSingletonDesc;
  string isSecondMateDesc;
  string isReverseDesc;
  string isProperPairDesc;
  string isPrimaryDesc;
  string isPairedDesc;
  string isMateReverseDesc;
  string tagDesc;
  string forceDesc;
  string scriptDesc;
  string usage;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__FilterTool_001f1ef0;
  pFVar1 = (FilterSettings *)operator_new(0x318);
  FilterSettings::FilterSettings(pFVar1);
  this->m_settings = pFVar1;
  this->m_impl = (FilterToolPrivate *)0x0;
  std::__cxx11::string::string
            ((string *)&usage,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename> | [-forceCompression]] [-region <REGION>] [ [-script <filename] | [filterOptions] ]"
             ,(allocator *)&inDesc);
  std::__cxx11::string::string((string *)&inDesc,"bamtools filter",(allocator *)&outDesc);
  std::__cxx11::string::string((string *)&listDesc,"filters BAM file(s)",(allocator *)&regionDesc);
  Options::SetProgramInfo(&inDesc,&listDesc,&usage);
  std::__cxx11::string::~string((string *)&listDesc);
  std::__cxx11::string::~string((string *)&inDesc);
  std::__cxx11::string::string((string *)&inDesc,"Input & Output",(allocator *)&listDesc);
  pOVar2 = Options::CreateOptionGroup(&inDesc);
  std::__cxx11::string::~string((string *)&inDesc);
  std::__cxx11::string::string((string *)&inDesc,"the input BAM file(s)",(allocator *)&listDesc);
  std::__cxx11::string::string
            ((string *)&listDesc,"the input BAM file list, one line per file",(allocator *)&outDesc)
  ;
  std::__cxx11::string::string((string *)&outDesc,"the output BAM file",(allocator *)&regionDesc);
  std::__cxx11::string::string
            ((string *)&regionDesc,
             "only read data from this genomic region (see documentation for more details)",
             (allocator *)&scriptDesc);
  std::__cxx11::string::string
            ((string *)&scriptDesc,"the filter script file (see documentation for more details)",
             (allocator *)&forceDesc);
  std::__cxx11::string::string
            ((string *)&forceDesc,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,(allocator *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"-in",(allocator *)&mapQualDesc);
  std::__cxx11::string::string((string *)&insertDesc,"BAM filename",(allocator *)&nameDesc);
  std::__cxx11::string::string((string *)&lengthDesc,"",(allocator *)&queryDesc);
  pFVar1 = this->m_settings;
  psVar3 = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (&flagDesc,&insertDesc,&inDesc,&lengthDesc,&pFVar1->HasInput,&pFVar1->InputFiles,pOVar2,
             psVar3);
  std::__cxx11::string::~string((string *)&lengthDesc);
  std::__cxx11::string::~string((string *)&insertDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"-list",(allocator *)&mapQualDesc);
  std::__cxx11::string::string((string *)&insertDesc,"filename",(allocator *)&nameDesc);
  std::__cxx11::string::string((string *)&lengthDesc,"",(allocator *)&queryDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&flagDesc,&insertDesc,&listDesc,&lengthDesc,&this->m_settings->HasInputFilelist,
             &this->m_settings->InputFilelist,pOVar2);
  std::__cxx11::string::~string((string *)&lengthDesc);
  std::__cxx11::string::~string((string *)&insertDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"-out",(allocator *)&mapQualDesc);
  std::__cxx11::string::string((string *)&insertDesc,"BAM filename",(allocator *)&nameDesc);
  std::__cxx11::string::string((string *)&lengthDesc,"",(allocator *)&queryDesc);
  pFVar1 = this->m_settings;
  psVar3 = Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&flagDesc,&insertDesc,&outDesc,&lengthDesc,&pFVar1->HasOutput,&pFVar1->OutputFilename,
             pOVar2,psVar3);
  std::__cxx11::string::~string((string *)&lengthDesc);
  std::__cxx11::string::~string((string *)&insertDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"-region",(allocator *)&mapQualDesc);
  std::__cxx11::string::string((string *)&insertDesc,"REGION",(allocator *)&nameDesc);
  std::__cxx11::string::string((string *)&lengthDesc,"",(allocator *)&queryDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&flagDesc,&insertDesc,&regionDesc,&lengthDesc,&this->m_settings->HasRegion,
             &this->m_settings->Region,pOVar2);
  std::__cxx11::string::~string((string *)&lengthDesc);
  std::__cxx11::string::~string((string *)&insertDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"-script",(allocator *)&mapQualDesc);
  std::__cxx11::string::string((string *)&insertDesc,"filename",(allocator *)&nameDesc);
  std::__cxx11::string::string((string *)&lengthDesc,"",(allocator *)&queryDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&flagDesc,&insertDesc,&scriptDesc,&lengthDesc,&this->m_settings->HasScript,
             &this->m_settings->ScriptFilename,pOVar2);
  std::__cxx11::string::~string((string *)&lengthDesc);
  std::__cxx11::string::~string((string *)&insertDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"-forceCompression",(allocator *)&insertDesc);
  Options::AddOption(&flagDesc,&forceDesc,&this->m_settings->IsForceCompression,pOVar2);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string((string *)&flagDesc,"General Filters",(allocator *)&insertDesc);
  pOVar2 = Options::CreateOptionGroup(&flagDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::string
            ((string *)&flagDesc,
             "keep reads with this *exact* alignment flag (for more detailed queries, see below)",
             (allocator *)&insertDesc);
  std::__cxx11::string::string
            ((string *)&insertDesc,"keep reads with insert size that matches pattern",
             (allocator *)&lengthDesc);
  std::__cxx11::string::string
            ((string *)&lengthDesc,"keep reads with length that matches pattern",
             (allocator *)&mapQualDesc);
  std::__cxx11::string::string
            ((string *)&mapQualDesc,"keep reads with map quality that matches pattern",
             (allocator *)&nameDesc);
  std::__cxx11::string::string
            ((string *)&nameDesc,"keep reads with name that matches pattern",(allocator *)&queryDesc
            );
  std::__cxx11::string::string
            ((string *)&queryDesc,"keep reads with motif that matches pattern",(allocator *)&tagDesc
            );
  std::__cxx11::string::string
            ((string *)&tagDesc,"keep reads with this key=>value pair",(allocator *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-alignmentFlag",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"int",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&flagDesc,&isFailQcDesc,&this->m_settings->HasAlignmentFlagFilter,
             &this->m_settings->AlignmentFlagFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-insertSize",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"int",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&insertDesc,&isFailQcDesc,&this->m_settings->HasInsertSizeFilter,
             &this->m_settings->InsertSizeFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-length",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"int",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&lengthDesc,&isFailQcDesc,&this->m_settings->HasLengthFilter,
             &this->m_settings->LengthFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-mapQuality",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"[0-255]",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&mapQualDesc,&isFailQcDesc,&this->m_settings->HasMapQualityFilter,
             &this->m_settings->MapQualityFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-name",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"string",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&nameDesc,&isFailQcDesc,&this->m_settings->HasNameFilter,
             &this->m_settings->NameFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-queryBases",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"string",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&queryDesc,&isFailQcDesc,&this->m_settings->HasQueryBasesFilter,
             &this->m_settings->QueryBasesFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"-tag",(allocator *)&isFirstMateDesc);
  std::__cxx11::string::string((string *)&isDupDesc,"TAG:VALUE",(allocator *)&isMappedDesc);
  std::__cxx11::string::string((string *)&isFailQcDesc,"",(allocator *)&isMateMappedDesc);
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&tagDesc,&isFailQcDesc,&this->m_settings->HasTagFilter,
             &this->m_settings->TagFilter,pOVar2);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"Alignment Flag Filters",(allocator *)&isDupDesc);
  pOVar2 = Options::CreateOptionGroup(&boolArg);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::string((string *)&boolArg,"true/false",(allocator *)&isDupDesc);
  std::__cxx11::string::string
            ((string *)&isDupDesc,"keep only alignments that are marked as duplicate?",
             (allocator *)&isFailQcDesc);
  std::__cxx11::string::string
            ((string *)&isFailQcDesc,"keep only alignments that failed QC?",
             (allocator *)&isFirstMateDesc);
  std::__cxx11::string::string
            ((string *)&isFirstMateDesc,"keep only alignments marked as first mate?",
             (allocator *)&isMappedDesc);
  std::__cxx11::string::string
            ((string *)&isMappedDesc,"keep only alignments that were mapped?",
             (allocator *)&isMateMappedDesc);
  std::__cxx11::string::string
            ((string *)&isMateMappedDesc,"keep only alignments with mates that mapped",
             (allocator *)&isMateReverseDesc);
  std::__cxx11::string::string
            ((string *)&isMateReverseDesc,"keep only alignments with mate on reverese strand?",
             (allocator *)&isPairedDesc);
  std::__cxx11::string::string
            ((string *)&isPairedDesc,"keep only alignments that were sequenced as paired?",
             (allocator *)&isPrimaryDesc);
  std::__cxx11::string::string
            ((string *)&isPrimaryDesc,"keep only alignments marked as primary?",
             (allocator *)&isProperPairDesc);
  std::__cxx11::string::string
            ((string *)&isProperPairDesc,"keep only alignments that passed PE resolution?",
             (allocator *)&isReverseDesc);
  std::__cxx11::string::string
            ((string *)&isReverseDesc,"keep only alignments on reverse strand?",
             (allocator *)&isSecondMateDesc);
  std::__cxx11::string::string
            ((string *)&isSecondMateDesc,"keep only alignments marked as second mate?",
             (allocator *)&isSingletonDesc);
  std::__cxx11::string::string
            ((string *)&isSingletonDesc,"keep only singletons",(allocator *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isDuplicate",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isDupDesc,&local_398,&this->m_settings->HasIsDuplicateFilter,
             &this->m_settings->IsDuplicateFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isFailedQC",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isFailQcDesc,&local_398,&this->m_settings->HasIsFailedQCFilter,
             &this->m_settings->IsFailedQCFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isFirstMate",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isFirstMateDesc,&local_398,&this->m_settings->HasIsFirstMateFilter
             ,&this->m_settings->IsFirstMateFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isMapped",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isMappedDesc,&local_398,&this->m_settings->HasIsMappedFilter,
             &this->m_settings->IsMappedFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isMateMapped",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isMateMappedDesc,&local_398,
             &this->m_settings->HasIsMateMappedFilter,&this->m_settings->IsMateMappedFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isMateReverseStrand",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isMateReverseDesc,&local_398,
             &this->m_settings->HasIsMateReverseStrandFilter,
             &this->m_settings->IsMateReverseStrandFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isPaired",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isPairedDesc,&local_398,&this->m_settings->HasIsPairedFilter,
             &this->m_settings->IsPairedFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isPrimaryAlignment",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isPrimaryDesc,&local_398,
             &this->m_settings->HasIsPrimaryAlignmentFilter,
             &this->m_settings->IsPrimaryAlignmentFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isProperPair",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isProperPairDesc,&local_398,
             &this->m_settings->HasIsProperPairFilter,&this->m_settings->IsProperPairFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isReverseStrand",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isReverseDesc,&local_398,
             &this->m_settings->HasIsReverseStrandFilter,&this->m_settings->IsReverseStrandFilter,
             pOVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isSecondMate",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isSecondMateDesc,&local_398,
             &this->m_settings->HasIsSecondMateFilter,&this->m_settings->IsSecondMateFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3b8,"-isSingleton",&local_3b9);
  std::__cxx11::string::string((string *)&local_398,"",&local_3ba);
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_3b8,&boolArg,&isSingletonDesc,&local_398,&this->m_settings->HasIsSingletonFilter
             ,&this->m_settings->IsSingletonFilter,pOVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TRUE_STR_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&isSingletonDesc);
  std::__cxx11::string::~string((string *)&isSecondMateDesc);
  std::__cxx11::string::~string((string *)&isReverseDesc);
  std::__cxx11::string::~string((string *)&isProperPairDesc);
  std::__cxx11::string::~string((string *)&isPrimaryDesc);
  std::__cxx11::string::~string((string *)&isPairedDesc);
  std::__cxx11::string::~string((string *)&isMateReverseDesc);
  std::__cxx11::string::~string((string *)&isMateMappedDesc);
  std::__cxx11::string::~string((string *)&isMappedDesc);
  std::__cxx11::string::~string((string *)&isFirstMateDesc);
  std::__cxx11::string::~string((string *)&isFailQcDesc);
  std::__cxx11::string::~string((string *)&isDupDesc);
  std::__cxx11::string::~string((string *)&boolArg);
  std::__cxx11::string::~string((string *)&tagDesc);
  std::__cxx11::string::~string((string *)&queryDesc);
  std::__cxx11::string::~string((string *)&nameDesc);
  std::__cxx11::string::~string((string *)&mapQualDesc);
  std::__cxx11::string::~string((string *)&lengthDesc);
  std::__cxx11::string::~string((string *)&insertDesc);
  std::__cxx11::string::~string((string *)&flagDesc);
  std::__cxx11::string::~string((string *)&forceDesc);
  std::__cxx11::string::~string((string *)&scriptDesc);
  std::__cxx11::string::~string((string *)&regionDesc);
  std::__cxx11::string::~string((string *)&outDesc);
  std::__cxx11::string::~string((string *)&listDesc);
  std::__cxx11::string::~string((string *)&inDesc);
  std::__cxx11::string::~string((string *)&usage);
  return;
}

Assistant:

FilterTool::FilterTool()
    : AbstractTool()
    , m_settings(new FilterSettings)
    , m_impl(0)
{
    // ----------------------------------
    // set program details

    const std::string usage =
        "[-in <filename> -in <filename> ... | -list <filelist>] "
        "[-out <filename> | [-forceCompression]] [-region <REGION>] "
        "[ [-script <filename] | [filterOptions] ]";

    Options::SetProgramInfo("bamtools filter", "filters BAM file(s)", usage);

    // ----------------------------------
    // I/O options

    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");

    const std::string inDesc = "the input BAM file(s)";
    const std::string listDesc = "the input BAM file list, one line per file";
    const std::string outDesc = "the output BAM file";
    const std::string regionDesc =
        "only read data from this genomic region (see documentation for more details)";
    const std::string scriptDesc = "the filter script file (see documentation for more details)";
    const std::string forceDesc =
        "if results are sent to stdout (like when piping to another tool), "
        "default behavior is to leave output uncompressed. Use this flag to "
        "override and force compression";

    Options::AddValueOption("-in", "BAM filename", inDesc, "", m_settings->HasInput,
                            m_settings->InputFiles, IO_Opts, Options::StandardIn());
    Options::AddValueOption("-list", "filename", listDesc, "", m_settings->HasInputFilelist,
                            m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", outDesc, "", m_settings->HasOutput,
                            m_settings->OutputFilename, IO_Opts, Options::StandardOut());
    Options::AddValueOption("-region", "REGION", regionDesc, "", m_settings->HasRegion,
                            m_settings->Region, IO_Opts);
    Options::AddValueOption("-script", "filename", scriptDesc, "", m_settings->HasScript,
                            m_settings->ScriptFilename, IO_Opts);
    Options::AddOption("-forceCompression", forceDesc, m_settings->IsForceCompression, IO_Opts);

    // ----------------------------------
    // general filter options

    OptionGroup* FilterOpts = Options::CreateOptionGroup("General Filters");

    const std::string flagDesc =
        "keep reads with this *exact* alignment flag (for more detailed queries, see below)";
    const std::string insertDesc = "keep reads with insert size that matches pattern";
    const std::string lengthDesc = "keep reads with length that matches pattern";
    const std::string mapQualDesc = "keep reads with map quality that matches pattern";
    const std::string nameDesc = "keep reads with name that matches pattern";
    const std::string queryDesc = "keep reads with motif that matches pattern";
    const std::string tagDesc = "keep reads with this key=>value pair";

    Options::AddValueOption("-alignmentFlag", "int", flagDesc, "",
                            m_settings->HasAlignmentFlagFilter, m_settings->AlignmentFlagFilter,
                            FilterOpts);
    Options::AddValueOption("-insertSize", "int", insertDesc, "", m_settings->HasInsertSizeFilter,
                            m_settings->InsertSizeFilter, FilterOpts);
    Options::AddValueOption("-length", "int", lengthDesc, "", m_settings->HasLengthFilter,
                            m_settings->LengthFilter, FilterOpts);
    Options::AddValueOption("-mapQuality", "[0-255]", mapQualDesc, "",
                            m_settings->HasMapQualityFilter, m_settings->MapQualityFilter,
                            FilterOpts);
    Options::AddValueOption("-name", "string", nameDesc, "", m_settings->HasNameFilter,
                            m_settings->NameFilter, FilterOpts);
    Options::AddValueOption("-queryBases", "string", queryDesc, "", m_settings->HasQueryBasesFilter,
                            m_settings->QueryBasesFilter, FilterOpts);
    Options::AddValueOption("-tag", "TAG:VALUE", tagDesc, "", m_settings->HasTagFilter,
                            m_settings->TagFilter, FilterOpts);

    // ----------------------------------
    // alignment flag filter options

    OptionGroup* AlignmentFlagOpts = Options::CreateOptionGroup("Alignment Flag Filters");

    const std::string boolArg = "true/false";
    const std::string isDupDesc = "keep only alignments that are marked as duplicate?";
    const std::string isFailQcDesc = "keep only alignments that failed QC?";
    const std::string isFirstMateDesc = "keep only alignments marked as first mate?";
    const std::string isMappedDesc = "keep only alignments that were mapped?";
    const std::string isMateMappedDesc = "keep only alignments with mates that mapped";
    const std::string isMateReverseDesc = "keep only alignments with mate on reverese strand?";
    const std::string isPairedDesc = "keep only alignments that were sequenced as paired?";
    const std::string isPrimaryDesc = "keep only alignments marked as primary?";
    const std::string isProperPairDesc = "keep only alignments that passed PE resolution?";
    const std::string isReverseDesc = "keep only alignments on reverse strand?";
    const std::string isSecondMateDesc = "keep only alignments marked as second mate?";
    const std::string isSingletonDesc = "keep only singletons";

    Options::AddValueOption("-isDuplicate", boolArg, isDupDesc, "",
                            m_settings->HasIsDuplicateFilter, m_settings->IsDuplicateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isFailedQC", boolArg, isFailQcDesc, "",
                            m_settings->HasIsFailedQCFilter, m_settings->IsFailedQCFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isFirstMate", boolArg, isFirstMateDesc, "",
                            m_settings->HasIsFirstMateFilter, m_settings->IsFirstMateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMapped", boolArg, isMappedDesc, "", m_settings->HasIsMappedFilter,
                            m_settings->IsMappedFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMateMapped", boolArg, isMateMappedDesc, "",
                            m_settings->HasIsMateMappedFilter, m_settings->IsMateMappedFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMateReverseStrand", boolArg, isMateReverseDesc, "",
                            m_settings->HasIsMateReverseStrandFilter,
                            m_settings->IsMateReverseStrandFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isPaired", boolArg, isPairedDesc, "", m_settings->HasIsPairedFilter,
                            m_settings->IsPairedFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isPrimaryAlignment", boolArg, isPrimaryDesc, "",
                            m_settings->HasIsPrimaryAlignmentFilter,
                            m_settings->IsPrimaryAlignmentFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isProperPair", boolArg, isProperPairDesc, "",
                            m_settings->HasIsProperPairFilter, m_settings->IsProperPairFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isReverseStrand", boolArg, isReverseDesc, "",
                            m_settings->HasIsReverseStrandFilter, m_settings->IsReverseStrandFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isSecondMate", boolArg, isSecondMateDesc, "",
                            m_settings->HasIsSecondMateFilter, m_settings->IsSecondMateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isSingleton", boolArg, isSingletonDesc, "",
                            m_settings->HasIsSingletonFilter, m_settings->IsSingletonFilter,
                            AlignmentFlagOpts, TRUE_STR);
}